

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CADFile.cpp
# Opt level: O2

bool CADFile::verifyFormat(vector<char,_std::allocator<char>_> *buf)

{
  bool bVar1;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"###Panel Added",&local_51)
  ;
  bVar1 = find_str_in_buf(&local_30,buf);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"C_PIN",&local_52);
    bVar1 = find_str_in_buf(&local_50,buf);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool CADFile::verifyFormat(std::vector<char> &buf) {
	return (find_str_in_buf("###Panel Added", buf) && find_str_in_buf("C_PIN", buf));
}